

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  int iVar1;
  cmPropertyMap *this_00;
  cmValue cVar2;
  string *psVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  pointer name;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string evaluatedValue;
  ostringstream e;
  string local_218;
  string *local_1f8;
  ImportPropertyMap *local_1f0;
  cmPropertyMap *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1f8 = errorMessage;
  local_1f0 = properties;
  this_00 = cmTarget::GetProperties(gte->Target);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"EXPORT_PROPERTIES","");
  cVar2 = cmPropertyMap::GetPropertyValue(this_00,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    local_1e8 = this_00;
    cmExpandedList_abi_cxx11_(&local_1c0,arg,false);
    if (local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      name = local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1a8[0]._M_string_length = (size_type)(name->_M_dataplus)._M_p;
        local_1a8[0]._M_dataplus._M_p = (pointer)name->_M_string_length;
        __str._M_str = "IMPORTED_";
        __str._M_len = 9;
        iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,9,__str);
        if (iVar1 == 0) {
LAB_0038ad12:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          psVar3 = cmTarget::GetName_abi_cxx11_(gte->Target);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar3->_M_dataplus)._M_p,
                              psVar3->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" contains property \"",0x15);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ",0x36);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"properties are reserved.",0x18)
          ;
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar1 = 1;
        }
        else {
          local_1a8[0]._M_string_length = (size_type)(name->_M_dataplus)._M_p;
          local_1a8[0]._M_dataplus._M_p = (pointer)name->_M_string_length;
          __str_00._M_str = "INTERFACE_";
          __str_00._M_len = 10;
          iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,10,
                             __str_00);
          if (iVar1 == 0) goto LAB_0038ad12;
          cVar2 = cmPropertyMap::GetPropertyValue(local_1e8,name);
          if (cVar2.Value == (string *)0x0) {
            iVar1 = 3;
          }
          else {
            cmGeneratorExpression::Preprocess
                      (&local_218,cVar2.Value,StripAllGeneratorExpressions,false);
            if (local_218._M_string_length == (cVar2.Value)->_M_string_length) {
              if (local_218._M_string_length != 0) {
                iVar1 = bcmp(local_218._M_dataplus._M_p,((cVar2.Value)->_M_dataplus)._M_p,
                             local_218._M_string_length);
                if (iVar1 != 0) goto LAB_0038ac2c;
              }
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](local_1f0,name);
              iVar1 = 0;
              std::__cxx11::string::_M_assign((string *)pmVar5);
            }
            else {
LAB_0038ac2c:
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              psVar3 = cmTarget::GetName_abi_cxx11_(gte->Target);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(psVar3->_M_dataplus)._M_p,
                                  psVar3->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"\" contains property \"",0x15);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"\" in EXPORT_PROPERTIES but this property contains a ",0x34);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"generator expression. This is not allowed.",0x2a);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)local_1f8,(string *)local_1e0);
              if (local_1e0[0] != local_1d0) {
                operator_delete(local_1e0[0],local_1d0[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              iVar1 = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((iVar1 != 3) && (iVar1 != 0)) goto LAB_0038ae49;
        name = name + 1;
      } while (name != local_1c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    }
    iVar1 = 2;
LAB_0038ae49:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    if (iVar1 != 2) goto LAB_0038ae5a;
  }
  iVar1 = 0;
LAB_0038ae5a:
  return iVar1 == 0;
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  const auto& targetProperties = gte->Target->GetProperties();
  if (cmValue exportProperties =
        targetProperties.GetPropertyValue("EXPORT_PROPERTIES")) {
    for (auto& prop : cmExpandedList(*exportProperties)) {
      /* Black list reserved properties */
      if (cmHasLiteralPrefix(prop, "IMPORTED_") ||
          cmHasLiteralPrefix(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      cmValue propertyValue = targetProperties.GetPropertyValue(prop);
      if (!propertyValue) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        *propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != *propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = *propertyValue;
    }
  }
  return true;
}